

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O1

string * __thiscall
GNB::predict_abi_cxx11_
          (string *__return_storage_ptr__,GNB *this,vector<double,_std::allocator<double>_> *sample)

{
  pointer pcVar1;
  double dVar2;
  pointer pbVar3;
  size_type *psVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  dVar10 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_left_s;
  dVar10 = exp((-dVar10 * dVar10) / (stddev_left_s * stddev_left_s + stddev_left_s * stddev_left_s))
  ;
  dVar11 = stddev_left_s * stddev_left_s * 6.283185307179586;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar12 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_left_d;
  dVar12 = exp((-dVar12 * dVar12) / (stddev_left_d * stddev_left_d + stddev_left_d * stddev_left_d))
  ;
  dVar5 = stddev_left_s * stddev_left_s * 6.283185307179586;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar13 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_left_s_dot;
  dVar13 = exp((-dVar13 * dVar13) /
               (stddev_left_s_dot * stddev_left_s_dot + stddev_left_s_dot * stddev_left_s_dot));
  dVar14 = stddev_left_s_dot * stddev_left_s_dot * 6.283185307179586;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  dVar15 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_left_d_dot;
  dVar15 = exp((-dVar15 * dVar15) /
               (stddev_left_d_dot * stddev_left_d_dot + stddev_left_d_dot * stddev_left_d_dot));
  dVar6 = stddev_left_d_dot * stddev_left_d_dot * 6.283185307179586;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar10 = (dVar10 / dVar11) * (dVar12 / dVar5) * (dVar13 / dVar14) * (dVar15 / dVar6) * p_left;
  dVar11 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_keep_s;
  dVar11 = exp((-dVar11 * dVar11) / (stddev_keep_s * stddev_keep_s + stddev_keep_s * stddev_keep_s))
  ;
  dVar12 = stddev_keep_s * stddev_keep_s * 6.283185307179586;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar5 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[1] - mean_keep_d;
  dVar5 = exp((-dVar5 * dVar5) / (stddev_keep_d * stddev_keep_d + stddev_keep_d * stddev_keep_d));
  dVar13 = stddev_keep_s * stddev_keep_s * 6.283185307179586;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar14 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_keep_s_dot;
  dVar14 = exp((-dVar14 * dVar14) /
               (stddev_keep_s_dot * stddev_keep_s_dot + stddev_keep_s_dot * stddev_keep_s_dot));
  dVar15 = stddev_keep_s_dot * stddev_keep_s_dot * 6.283185307179586;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  dVar6 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[3] - mean_keep_d_dot;
  dVar6 = exp((-dVar6 * dVar6) /
              (stddev_keep_d_dot * stddev_keep_d_dot + stddev_keep_d_dot * stddev_keep_d_dot));
  dVar7 = stddev_keep_d_dot * stddev_keep_d_dot * 6.283185307179586;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar2 = p_keep;
  dVar16 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_right_s;
  dVar16 = exp((-dVar16 * dVar16) /
               (stddev_right_s * stddev_right_s + stddev_right_s * stddev_right_s));
  dVar17 = stddev_right_s * stddev_right_s * 6.283185307179586;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar18 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_right_d;
  dVar18 = exp((-dVar18 * dVar18) /
               (stddev_right_d * stddev_right_d + stddev_right_d * stddev_right_d));
  dVar8 = stddev_right_s * stddev_right_s * 6.283185307179586;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar19 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_right_s_dot;
  dVar19 = exp((-dVar19 * dVar19) /
               (stddev_right_s_dot * stddev_right_s_dot + stddev_right_s_dot * stddev_right_s_dot));
  dVar20 = stddev_right_s_dot * stddev_right_s_dot * 6.283185307179586;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  dVar21 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_right_d_dot;
  dVar21 = exp((-dVar21 * dVar21) /
               (stddev_right_d_dot * stddev_right_d_dot + stddev_right_d_dot * stddev_right_d_dot));
  dVar9 = stddev_right_d_dot * stddev_right_d_dot * 6.283185307179586;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  if ((dVar16 / dVar17) * (dVar18 / dVar8) * (dVar19 / dVar20) * (dVar21 / dVar9) * p_right <=
      dVar10) {
    pbVar3 = (this->possible_labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (dVar2 * (dVar6 / dVar7) * (dVar14 / dVar15) * (dVar5 / dVar13) * (dVar11 / dVar12) <= dVar10
       ) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = &pbVar3->_M_string_length;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = &pbVar3[1]._M_string_length;
      pbVar3 = pbVar3 + 1;
    }
  }
  else {
    pbVar3 = (this->possible_labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = &pbVar3[1]._M_string_length;
    pbVar3 = pbVar3 + 1;
  }
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + *psVar4);
  return __return_storage_ptr__;
}

Assistant:

string GNB::predict(const vector<double> &sample)
{
  /**
   * Once trained, this method is called and expected to return 
   *   a predicted behavior for the given observation.
   * @param observation - a 4 tuple with s, d, s_dot, d_dot.
   *   - Example: [3.5, 0.1, 8.5, -0.2]
   * @output A label representing the best guess of the classifier. Can
   *   be one of "left", "keep" or "right".
   *
   * TODO: Complete this function to return your classifier's prediction
   */
  double prob_s;
  double prob_left = 1;
  double prob_keep = 1;
  double prob_right = 1;

  // prob of s being left * prob of d being left * prob of sdot being left * prob of ddot being left
  // prob of s being keep * prob of d being keep * prob of sdot being keep * prob of ddot being keep
  // prob of s being right * prob of d being right * prob of sdot being right * prob of ddot being right
  // Once you have all these probs, find the max one out of them.

  // prob of being left
  prob_s = exp(-1 * pow(sample[0] - mean_left_s, 2) / (2 * pow(stddev_left_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_left_d, 2) / (2 * pow(stddev_left_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_left_s_dot, 2) / (2 * pow(stddev_left_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s_dot, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_left_d_dot, 2) / (2 * pow(stddev_left_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_d_dot, 2));
  prob_left *= prob_s;
  prob_left *= p_left;

  // prob of being keep
  prob_s = exp(-1 * pow(sample[0] - mean_keep_s, 2) / (2 * pow(stddev_keep_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_keep_d, 2) / (2 * pow(stddev_keep_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_keep_s_dot, 2) / (2 * pow(stddev_keep_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s_dot, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_keep_d_dot, 2) / (2 * pow(stddev_keep_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_d_dot, 2));
  prob_keep *= prob_s;
  prob_keep *= p_keep;

  // prob of being right
  prob_s = exp(-1 * pow(sample[0] - mean_right_s, 2) / (2 * pow(stddev_right_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_right_d, 2) / (2 * pow(stddev_right_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_right_s_dot, 2) / (2 * pow(stddev_right_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s_dot, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_right_d_dot, 2) / (2 * pow(stddev_right_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_d_dot, 2));
  prob_right *= prob_s;
  prob_right *= p_right;

  if (prob_left >= prob_right)
  {
    if (prob_left >= prob_keep)
    {
      return this->possible_labels[0];
    }
    else
    {
      return this->possible_labels[1];
    }
  }
  else
  {
    return this->possible_labels[1];
  }
}